

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::detail::rawMemoryToString(String *__return_storage_ptr__,void *object,uint size)

{
  _func_int *p_Var1;
  code cVar2;
  ostream *poVar3;
  long lVar4;
  
  poVar3 = tlssPush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"0x",2);
  p_Var1 = (_func_int *)((long)&poVar3->_vptr_basic_ostream + (long)poVar3->_vptr_basic_ostream[-3])
  ;
  if ((&poVar3->field_0xe1)[(long)poVar3->_vptr_basic_ostream[-3]] == '\0') {
    cVar2 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar2;
    p_Var1[0xe1] = (code)0x1;
  }
  p_Var1[0xe0] = (code)0x30;
  *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  if (size != 0) {
    lVar4 = (long)(int)size;
    do {
      *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostream*        oss   = tlssPush();
        *oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            *oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return tlssPop();
    }